

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  URL *this;
  _Base_ptr p_Var1;
  ostream *poVar2;
  int iVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  headers;
  string adress;
  string local_388;
  string local_368;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  string local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  Log local_1a8;
  HttpClient client;
  Log log;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  HttpResponse response;
  
  adress._M_dataplus._M_p = (pointer)&adress.field_2;
  adress._M_string_length = 0;
  adress.field_2._M_local_buf[0] = '\0';
  if (argc < 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"No URL adress provided");
    std::operator<<(poVar2,"\n");
    iVar3 = -1;
  }
  else {
    std::__cxx11::string::assign((char *)&adress);
    Log::Log(&log,printOut);
    Log::Log(&local_1a8,&log);
    HttpClient::HttpClient(&client,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::string((string *)&local_1c8,(string *)&adress);
    std::__cxx11::string::string((string *)&local_1e8,"GET",(allocator *)&headers);
    HttpClient::RunRequest(&response,&client,&local_1c8,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::string
              ((string *)&local_208,"Client was called, ok!",(allocator *)&headers);
    printOut(&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    this = HttpResponse::GetRequestURL(&response);
    if (this == (URL *)0x0) {
      std::operator<<((ostream *)&std::cout,"The URL is dead");
    }
    std::__cxx11::string::string
              ((string *)&local_228,"Request information-------------------",(allocator *)&headers);
    printOut(&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    URL::GetFullURL_abi_cxx11_((string *)&headers,this);
    std::operator+(&local_248,"Full URL: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&headers);
    printOut(&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&headers);
    URL::GetProtocoll_abi_cxx11_((string *)&headers,this);
    std::operator+(&local_268,"Protocoll: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&headers);
    printOut(&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&headers);
    URL::GetHostName_abi_cxx11_((string *)&headers,this);
    std::operator+(&local_288,"Host name: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&headers);
    printOut(&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&headers);
    URL::GetPortNumber_abi_cxx11_((string *)&headers,this);
    std::operator+(&local_2a8,"Port number: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&headers);
    printOut(&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&headers);
    std::__cxx11::string::string
              ((string *)&local_2c8,"Basic information---------------------",(allocator *)&headers);
    printOut(&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    HttpResponse::GetHttpVersion_abi_cxx11_((string *)&headers,&response);
    std::operator+(&local_2e8,"Version: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&headers);
    printOut(&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&headers);
    HttpResponse::GetHttpStatusCode_abi_cxx11_((string *)&headers,&response);
    std::operator+(&local_308,"Status code: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&headers);
    printOut(&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&headers);
    HttpResponse::GetHttpStatusText_abi_cxx11_((string *)&headers,&response);
    std::operator+(&local_328,"Status text: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&headers);
    printOut(&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&headers);
    std::__cxx11::string::string
              ((string *)&local_348,"Header information---------------------",(allocator *)&headers)
    ;
    printOut(&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    HttpResponse::GetHttpHeaders_abi_cxx11_(&headers,&response);
    for (p_Var1 = headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &headers._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      std::operator+(&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var1 + 1),": ");
      std::operator+(&local_110,&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var1 + 2));
      printOut(&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
    }
    std::__cxx11::string::string
              ((string *)&local_368,"Raw response-------------------------",(allocator *)&local_130)
    ;
    printOut(&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    HttpResponse::GetRawResponse_abi_cxx11_(&local_388,&response);
    printOut(&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&headers._M_t);
    HttpResponse::~HttpResponse(&response);
    std::__cxx11::string::~string((string *)&client);
    std::__cxx11::string::~string((string *)&log);
    iVar3 = 0;
  }
  std::__cxx11::string::~string((string *)&adress);
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
  std::string adress;
  if (argc > 1) {
    adress = argv[1];
  } else {
    std::cout << "No URL adress provided" << "\n";
    return -1;
  }

  Log log(printOut);
  HttpClient client(log);

  try {
    HttpResponse response = client.RunRequest(adress, "GET");
    printOut("Client was called, ok!");
    URL* urlObject = response.GetRequestURL();

    if (urlObject == nullptr) {
      std::cout << "The URL is dead";
    }

    printOut("Request information-------------------");
    printOut("Full URL: " + urlObject->GetFullURL());
    printOut("Protocoll: " + urlObject->GetProtocoll());
    printOut("Host name: " + urlObject->GetHostName());
    printOut("Port number: " + urlObject->GetPortNumber());

    printOut("Basic information---------------------");
    printOut("Version: " + response.GetHttpVersion());
    printOut("Status code: " + response.GetHttpStatusCode());
    printOut("Status text: " + response.GetHttpStatusText());

    printOut("Header information---------------------");
    std::map<std::string, std::string> headers = response.GetHttpHeaders();
    std::map<std::string, std::string>::iterator it;
    for (it=headers.begin(); it != headers.end(); ++it) {
      printOut(it->first + ": " + it->second);
    }
    printOut("Raw response-------------------------");
    printOut(response.GetRawResponse());
  } catch (int e) {
      printOut("An unhandled exception occured");
  }
  return 0;
}